

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-cast-registerer.cpp
# Opt level: O0

void __thiscall custom_vector_registerer::test_method(custom_vector_registerer *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ExceptionSignal *e_6;
  undefined1 local_1570 [8];
  output_test_stream output_2;
  ExceptionSignal *e_5;
  string local_13e0 [32];
  istringstream local_13c0 [8];
  istringstream ss_6;
  ExceptionSignal *e_4;
  string local_1230 [32];
  istringstream local_1210 [8];
  istringstream ss_5;
  ExceptionSignal *e_3;
  string local_1080 [32];
  istringstream local_1060 [8];
  istringstream ss_4;
  ExceptionSignal *e_2;
  string local_ed0 [32];
  istringstream local_eb0 [8];
  istringstream ss_3;
  ExceptionSignal *e_1;
  string local_d20 [32];
  istringstream local_d00 [8];
  istringstream ss_2;
  ExceptionSignal *e;
  string local_b70 [32];
  istringstream local_b50 [8];
  istringstream ss_1;
  basic_cstring<const_char> local_9d0;
  basic_cstring<const_char> local_9c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_9b0;
  string_type local_990;
  basic_cstring<const_char> local_970;
  assertion_result local_960;
  basic_cstring<const_char> local_948;
  basic_cstring<const_char> local_938;
  bool local_925;
  bool local_924;
  bool local_923;
  bool local_922;
  bool local_921;
  undefined1 local_920 [8];
  format fmt;
  undefined1 local_830 [8];
  output_test_stream output_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  istringstream local_650 [8];
  istringstream ss;
  undefined1 local_4d0 [8];
  ostringstream os;
  BasisReturnType local_358;
  undefined1 local_320 [8];
  Vector v;
  undefined1 local_308 [4];
  uint i;
  basic_cstring<const_char> local_2f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2e8;
  basic_cstring<const_char> local_2c8;
  assertion_result local_2b8;
  basic_cstring<const_char> local_2a0;
  basic_cstring<const_char> local_290;
  basic_cstring<const_char> local_280;
  undefined1 local_270 [8];
  output_test_stream output;
  allocator<char> local_d9;
  string local_d8;
  undefined1 local_b8 [8];
  Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> myVectorSignal;
  custom_vector_registerer *this_local;
  
  myVectorSignal.providerMutex = (Mutex *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"vector",&local_d9);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::Signal
            ((Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *)local_b8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_280);
  boost::test_tools::output_test_stream::output_test_stream
            ((output_test_stream *)local_270,&local_280,1);
  dynamicgraph::operator<<((ostream *)local_270,(SignalBase<int> *)local_b8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/signal-cast-registerer.cpp"
               ,0x71);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_290,0x56,&local_2a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2c8,"Sig:vector (Type Cst)");
    boost::test_tools::output_test_stream::is_equal(&local_2b8,local_270,&local_2c8,1);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f8,"output.is_equal(\"Sig:vector (Type Cst)\")",0x28);
    boost::unit_test::operator<<(&local_2e8,plVar3,&local_2f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_308,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/signal-cast-registerer.cpp"
               ,0x71);
    boost::test_tools::tt_detail::report_assertion(&local_2b8,&local_2e8,local_308,0x56,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2e8);
    boost::test_tools::assertion_result::~assertion_result(&local_2b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  boost::test_tools::output_test_stream::~output_test_stream((output_test_stream *)local_270);
  for (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 0;
      v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ < 5;
      v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
           v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ +
           1) {
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Unit
              (&local_358,5,
               (ulong)v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows._4_4_);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const,_1,1,false>>
              ((Matrix<double,_1,1,0,_1,1> *)local_320,
               (EigenBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false>_>
                *)&local_358);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d0);
    Eigen::operator<<((ostream *)local_4d0,
                      (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_320);
    std::__cxx11::ostringstream::str();
    std::operator+(&local_690,"[5](",&local_6b0);
    std::operator+(&local_670,&local_690,")");
    std::__cxx11::istringstream::istringstream(local_650,(string *)&local_670,_S_in);
    std::__cxx11::string::~string((string *)&local_670);
    std::__cxx11::string::~string((string *)&local_690);
    std::__cxx11::string::~string((string *)&local_6b0);
    dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::set
              ((Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *)local_b8,
               (istringstream *)local_650);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)&fmt.loc_.super_type.m_storage);
    boost::test_tools::output_test_stream::output_test_stream
              ((output_test_stream *)local_830,&fmt.loc_.super_type.m_storage,1);
    dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::get
              ((Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *)local_b8,(ostream *)local_830)
    ;
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_920,
               "%d %d %d %d %d");
    local_921 = v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
                _4_4_ == 0;
    pbVar4 = boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
                       ((basic_format<char,std::char_traits<char>,std::allocator<char>> *)local_920,
                        &local_921);
    local_922 = v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
                _4_4_ == 1;
    pbVar4 = boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
                       ((basic_format<char,std::char_traits<char>,std::allocator<char>> *)pbVar4,
                        &local_922);
    local_923 = v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
                _4_4_ == 2;
    pbVar4 = boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
                       ((basic_format<char,std::char_traits<char>,std::allocator<char>> *)pbVar4,
                        &local_923);
    local_924 = v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
                _4_4_ == 3;
    pbVar4 = boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
                       ((basic_format<char,std::char_traits<char>,std::allocator<char>> *)pbVar4,
                        &local_924);
    local_925 = v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
                _4_4_ == 4;
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
              ((basic_format<char,std::char_traits<char>,std::allocator<char>> *)pbVar4,&local_925);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_938,
                 "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/signal-cast-registerer.cpp"
                 ,0x71);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_948);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_938,0x69,&local_948);
      boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
                (&local_990,
                 (basic_format<char,std::char_traits<char>,std::allocator<char>> *)local_920);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_970,&local_990);
      boost::test_tools::output_test_stream::is_equal(&local_960,local_830,&local_970,1);
      plVar3 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_9c0,"output.is_equal(fmt.str())",0x1a);
      boost::unit_test::operator<<(&local_9b0,plVar3,&local_9c0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_9d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/signal-cast-registerer.cpp"
                 ,0x71);
      boost::test_tools::tt_detail::report_assertion(&local_960,&local_9b0,&local_9d0,0x69,1,0,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_9b0);
      boost::test_tools::assertion_result::~assertion_result(&local_960);
      std::__cxx11::string::~string((string *)&local_990);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
              ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_920);
    boost::test_tools::output_test_stream::~output_test_stream((output_test_stream *)local_830);
    std::__cxx11::istringstream::~istringstream(local_650);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d0);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_320);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b70,"test",(allocator<char> *)((long)&e + 7));
  std::__cxx11::istringstream::istringstream(local_b50,local_b70,_S_in);
  std::__cxx11::string::~string(local_b70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::set
            ((Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *)local_b8,
             (istringstream *)local_b50);
  std::__cxx11::istringstream::~istringstream(local_b50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d20,"[test",(allocator<char> *)((long)&e_1 + 7));
  std::__cxx11::istringstream::istringstream(local_d00,local_d20,_S_in);
  std::__cxx11::string::~string(local_d20);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_1 + 7));
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::set
            ((Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *)local_b8,
             (istringstream *)local_d00);
  std::__cxx11::istringstream::~istringstream(local_d00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_ed0,"[5[",(allocator<char> *)((long)&e_2 + 7));
  std::__cxx11::istringstream::istringstream(local_eb0,local_ed0,_S_in);
  std::__cxx11::string::~string(local_ed0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_2 + 7));
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::set
            ((Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *)local_b8,
             (istringstream *)local_eb0);
  std::__cxx11::istringstream::~istringstream(local_eb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1080,"[5]test",(allocator<char> *)((long)&e_3 + 7));
  std::__cxx11::istringstream::istringstream(local_1060,local_1080,_S_in);
  std::__cxx11::string::~string(local_1080);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_3 + 7));
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::set
            ((Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *)local_b8,
             (istringstream *)local_1060);
  std::__cxx11::istringstream::~istringstream(local_1060);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1230,"[5](1, ",(allocator<char> *)((long)&e_4 + 7));
  std::__cxx11::istringstream::istringstream(local_1210,local_1230,_S_in);
  std::__cxx11::string::~string(local_1230);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_4 + 7));
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::set
            ((Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *)local_b8,
             (istringstream *)local_1210);
  std::__cxx11::istringstream::~istringstream(local_1210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_13e0,"[5](1,2,3,4,5]",(allocator<char> *)((long)&e_5 + 7));
  std::__cxx11::istringstream::istringstream(local_13c0,local_13e0,_S_in);
  std::__cxx11::string::~string(local_13e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_5 + 7));
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::set
            ((Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *)local_b8,
             (istringstream *)local_13c0);
  std::__cxx11::istringstream::~istringstream(local_13c0);
  boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)&e_6);
  boost::test_tools::output_test_stream::output_test_stream((output_test_stream *)local_1570,&e_6,1)
  ;
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::trace
            ((Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *)local_b8,(ostream *)local_1570);
  boost::test_tools::output_test_stream::~output_test_stream((output_test_stream *)local_1570);
  dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::~Signal
            ((Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *)local_b8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(custom_vector_registerer) {
  dynamicgraph::Signal<dynamicgraph::Vector, int> myVectorSignal("vector");

  // Print the signal name.
  {
    output_test_stream output;
    output << myVectorSignal;
    BOOST_CHECK(output.is_equal("Sig:vector (Type Cst)"));
  }

  for (unsigned int i = 0; i < 5; ++i) {
    Vector v = Vector::Unit(5, i);
    std::ostringstream os;
    os << v;
    std::istringstream ss("[5](" + os.str() + ")");

    // Set signal value.
    myVectorSignal.set(ss);

    // Print out signal value.
    output_test_stream output;
    myVectorSignal.get(output);

    boost::format fmt("%d %d %d %d %d");
    fmt % (i == 0) % (i == 1) % (i == 2) % (i == 3) % (i == 4);

    BOOST_CHECK(output.is_equal(fmt.str()));
  }

  // Catch Exception of ss (not good input)

  // ss[0] != "["
  try {
    std::istringstream ss("test");
    myVectorSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[0] != \"[\"";
  }

  // ss[1] != %i
  try {
    std::istringstream ss("[test");
    myVectorSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[1] != %i";
  }

  // ss[2] != "]"
  try {
    std::istringstream ss("[5[");
    myVectorSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[2] != \"]\"";
  }

  // ss[3] != "("
  try {
    std::istringstream ss("[5]test");
    myVectorSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[3] != \"(\"";
  }

  // ss[4] != ' ' || ','
  try {
    std::istringstream ss("[5](1, ");
    myVectorSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[4] != \" \" || \",\"";
  }

  // ss[-1] != ")"
  try {
    std::istringstream ss("[5](1,2,3,4,5]");
    myVectorSignal.set(ss);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[-1] != \")\"";
  }

  try {
    output_test_stream output;
    myVectorSignal.trace(output);
  } catch (ExceptionSignal &e) {
    std::cout << "Test passed : ss[-1] != \")\"";
  }
}